

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall TArray<FSpotList,_FSpotList>::Resize(TArray<FSpotList,_FSpotList> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uint amount_00;
  
  uVar2 = this->Count;
  amount_00 = amount - uVar2;
  if (amount < uVar2 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar2 - 1);
    }
  }
  else {
    Grow(this,amount_00);
    uVar3 = (ulong)this->Count;
    lVar4 = uVar3 * 0x28 + 8;
    for (; uVar3 < amount; uVar3 = uVar3 + 1) {
      puVar1 = (undefined8 *)((long)&this->Array->Type + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 0x28;
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}